

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error
astcenc_compress_image
          (astcenc_context *ctxo,astcenc_image *imagep,astcenc_swizzle *swizzle,uint8_t *data_out,
          size_t data_len,uint thread_index)

{
  atomic<unsigned_int> *paVar1;
  ParallelManager *this;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  astcenc_profile aVar9;
  block_size_descriptor *pbVar10;
  compression_working_buffers *pcVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar18;
  uint uVar19;
  int iVar20;
  EVP_PKEY_CTX *pEVar21;
  uint uVar22;
  uint uVar23;
  EVP_PKEY_CTX *ctx;
  void *__stat_loc;
  bool bVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  astcenc_error aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint local_1150;
  uint local_1140;
  uint local_1138;
  code *local_1128;
  _Any_data local_10c0;
  code *pcStack_10b0;
  code *pcStack_10a8;
  undefined8 *local_10a0;
  undefined8 uStack_1098;
  code *pcStack_1090;
  code *pcStack_1088;
  undefined1 local_1080 [32];
  uint local_1060;
  uint uStack_105c;
  uint uStack_1058;
  uint uStack_1054;
  uint uStack_1050;
  uint uStack_104c;
  vfloat4 *pvStack_1048;
  uint8_t local_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  vfloat4 local_240;
  bool local_230;
  bool local_22f;
  void *pvVar17;
  
  aVar31 = ASTCENC_ERR_BAD_CONTEXT;
  if (((ctxo->context).config.flags & 0x10) == 0) {
    auVar32._8_4_ = 6;
    auVar32._0_8_ = 0x600000006;
    auVar32._12_4_ = 6;
    auVar32 = vpmaxud_avx((undefined1  [16])*swizzle,auVar32);
    auVar32 = vpcmpeqd_avx((undefined1  [16])*swizzle,auVar32);
    aVar31 = ASTCENC_ERR_BAD_SWIZZLE;
    if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf]) {
      uVar7 = (ctxo->context).thread_count;
      aVar31 = ASTCENC_ERR_BAD_PARAM;
      if (thread_index < uVar7) {
        uVar8 = (ctxo->context).config.block_x;
        uVar23 = (ctxo->context).config.block_y;
        uVar26 = (ctxo->context).config.block_z;
        ctx = (EVP_PKEY_CTX *)
              (ulong)((((uVar23 + imagep->dim_y) - 1) / uVar23) *
                      (((imagep->dim_x + uVar8) - 1) / uVar8) *
                      (((imagep->dim_z + uVar26) - 1) / uVar26) * 0x10);
        aVar31 = ASTCENC_ERR_OUT_OF_MEM;
        if (ctx <= data_len) {
          if (uVar7 == 1) {
            astcenc_compress_reset(ctxo);
          }
          if ((ctxo->context).config.a_scale_radius != 0) {
            ctx = (EVP_PKEY_CTX *)&local_10a0;
            local_10a0 = (undefined8 *)0x0;
            uStack_1098 = 0;
            pcStack_1090 = (code *)0x0;
            pcStack_1088 = (code *)0x0;
            local_10a0 = (undefined8 *)operator_new(0x18);
            *local_10a0 = ctxo;
            local_10a0[1] = imagep;
            local_10a0[2] = swizzle;
            pcStack_1088 = std::
                           _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1069:19)>
                           ::_M_invoke;
            pcStack_1090 = std::
                           _Function_handler<unsigned_int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1069:19)>
                           ::_M_manager;
            ParallelManager::init(&ctxo->manage_avg,ctx);
            if (pcStack_1090 != (code *)0x0) {
              ctx = (EVP_PKEY_CTX *)&local_10a0;
              (*pcStack_1090)(ctx,ctx,3);
            }
            local_1080._0_8_ = (ctxo->context).avg_preprocess_args.arg.img;
            local_1080._8_4_ = (ctxo->context).avg_preprocess_args.arg.swz.r;
            local_1080._12_4_ = (ctxo->context).avg_preprocess_args.arg.swz.g;
            local_1080._16_4_ = (ctxo->context).avg_preprocess_args.arg.swz.b;
            local_1080._20_4_ = (ctxo->context).avg_preprocess_args.arg.swz.a;
            local_1080[0x18] = (ctxo->context).avg_preprocess_args.arg.have_z;
            local_1080._25_3_ = *(undefined3 *)&(ctxo->context).avg_preprocess_args.arg.field_0x19;
            local_1080._28_4_ = (ctxo->context).avg_preprocess_args.arg.alpha_kernel_radius;
            local_1060 = (ctxo->context).avg_preprocess_args.arg.size_x;
            uStack_105c = (ctxo->context).avg_preprocess_args.arg.size_y;
            uStack_1058 = (ctxo->context).avg_preprocess_args.arg.size_z;
            uStack_1054 = (ctxo->context).avg_preprocess_args.arg.offset_x;
            uStack_1050 = (ctxo->context).avg_preprocess_args.arg.offset_y;
            uStack_104c = (ctxo->context).avg_preprocess_args.arg.offset_z;
            pvStack_1048 = (ctxo->context).avg_preprocess_args.arg.work_memory;
            pvStack_1048 = (vfloat4 *)
                           operator_new__((ulong)(ctxo->context).avg_preprocess_args.
                                                 work_memory_size << 4);
            uVar7 = (ctxo->context).avg_preprocess_args.img_size_x;
            uVar8 = (ctxo->context).avg_preprocess_args.img_size_y;
            uVar23 = (ctxo->context).avg_preprocess_args.img_size_z;
            uVar26 = (ctxo->context).avg_preprocess_args.blk_size_xy;
            uVar19 = (ctxo->context).avg_preprocess_args.blk_size_z;
            uVar13 = (int)(uVar8 + uVar26 + -1) / (int)uVar26;
            while( true ) {
              LOCK();
              paVar1 = &(ctxo->manage_avg).m_start_count;
              uVar16 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
              (paVar1->super___atomic_base<unsigned_int>)._M_i =
                   (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x10;
              UNLOCK();
              pEVar21 = (EVP_PKEY_CTX *)0x0;
              uVar27 = 0;
              if (((ctxo->manage_avg).m_is_cancelled._M_base._M_i & 1U) == 0) {
                uVar14 = (ctxo->manage_avg).m_task_count;
                pEVar21 = (EVP_PKEY_CTX *)0x0;
                uVar27 = 0;
                uVar18 = uVar14 - uVar16;
                if (uVar16 <= uVar14 && uVar18 != 0) {
                  if (0xf < uVar18) {
                    uVar18 = 0x10;
                  }
                  pEVar21 = (EVP_PKEY_CTX *)(ulong)uVar18;
                  uVar27 = (ulong)uVar16;
                }
              }
              uVar16 = (uint)pEVar21;
              if (uVar16 == 0) break;
              uVar14 = (uint)uVar27 + uVar16;
              if ((uint)uVar27 < uVar14) {
                do {
                  uStack_104c = (int)(uVar27 / uVar13) * uVar19;
                  uStack_1050 = ((int)uVar27 - uStack_104c * uVar13) * uVar26;
                  uVar18 = uVar23 - uStack_104c;
                  if ((int)uVar19 < (int)uVar18) {
                    uVar18 = uVar19;
                  }
                  uVar22 = uVar8 - uStack_1050;
                  if ((int)uVar26 < (int)uVar22) {
                    uVar22 = uVar26;
                  }
                  uStack_1058 = uVar18;
                  uStack_105c = uVar22;
                  if (0 < (int)uVar7) {
                    uVar22 = 0;
                    uVar18 = uVar7;
                    do {
                      uVar15 = uVar18;
                      if ((int)uVar26 < (int)uVar18) {
                        uVar15 = uVar26;
                      }
                      uVar18 = -(uVar26 - uVar18);
                      local_1060 = uVar15;
                      uStack_1054 = uVar22;
                      compute_pixel_region_variance(&ctxo->context,(pixel_region_args *)local_1080);
                      uVar22 = uVar22 + uVar26;
                    } while ((int)uVar22 < (int)uVar7);
                  }
                  uVar18 = (int)uVar27 + 1;
                  uVar27 = (ulong)uVar18;
                } while (uVar18 != uVar14);
              }
              ParallelManager::complete_task_assignment(&ctxo->manage_avg,uVar16);
              ctx = pEVar21;
            }
            if (pvStack_1048 != (vfloat4 *)0x0) {
              operator_delete__(pvStack_1048);
            }
          }
          ParallelManager::wait(&ctxo->manage_avg,ctx);
          pbVar10 = (ctxo->context).bsd;
          aVar9 = (ctxo->context).config.profile;
          bVar4 = pbVar10->xdim;
          bVar5 = pbVar10->ydim;
          bVar6 = pbVar10->zdim;
          local_284 = bVar5 * bVar4 * bVar6;
          uVar7 = imagep->dim_x;
          uVar8 = imagep->dim_y;
          uVar23 = (int)(bVar4 + uVar7 + -1) / (int)(uint)bVar4;
          iVar25 = (int)(bVar5 + uVar8 + -1) / (int)(uint)bVar5;
          uVar26 = iVar25 * uVar23;
          local_22f = (bool)((byte)(ctxo->context).config.flags >> 1 & 1);
          local_240.m[0] = (ctxo->context).config.cw_r_weight;
          local_240.m[1] = (ctxo->context).config.cw_g_weight;
          local_240.m[2] = (ctxo->context).config.cw_b_weight;
          local_240.m[3] = (ctxo->context).config.cw_a_weight;
          pcVar11 = (ctxo->context).working_buffers;
          this = &ctxo->manage_compress;
          ParallelManager::init
                    (this,(EVP_PKEY_CTX *)
                          (ulong)(((int)((uint)bVar6 + imagep->dim_z + -1) / (int)(uint)bVar6) *
                                 uVar26));
          local_1128 = load_image_block;
          if (((*swizzle == _DAT_0027d3d0) &&
              ((aVar9 & ~ASTCENC_PRF_LDR) != ASTCENC_PRF_HDR_RGB_LDR_A)) && (bVar6 == 1)) {
            if (imagep->data_type == ASTCENC_TYPE_U8) {
              local_1128 = load_image_block_fast_ldr;
            }
            else {
              local_1128 = load_image_block;
            }
          }
          while( true ) {
            LOCK();
            paVar1 = &(ctxo->manage_compress).m_start_count;
            uVar19 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
            __stat_loc = (void *)(ulong)uVar19;
            (paVar1->super___atomic_base<unsigned_int>)._M_i =
                 (paVar1->super___atomic_base<unsigned_int>)._M_i + 0x10;
            UNLOCK();
            pvVar17 = (void *)0x0;
            uVar13 = 0;
            if (((ctxo->manage_compress).m_is_cancelled._M_base._M_i & 1U) == 0) {
              uVar16 = (ctxo->manage_compress).m_task_count;
              uVar14 = uVar16 - uVar19;
              pvVar17 = (void *)0x0;
              uVar13 = 0;
              if ((uVar19 <= uVar16 && uVar14 != 0) &&
                 (pvVar17 = __stat_loc, uVar13 = uVar14, 0xf < uVar14)) {
                uVar13 = 0x10;
              }
            }
            if (uVar13 == 0) break;
            uVar19 = (uint)pvVar17 + uVar13;
            if ((uint)pvVar17 < uVar19) {
              do {
                uVar27 = (ulong)pvVar17 % (ulong)uVar26;
                iVar28 = (int)(uVar27 / uVar23);
                iVar20 = (int)(uVar27 % (ulong)uVar23);
                uVar16 = (ctxo->context).config.a_scale_radius;
                iVar30 = (int)((ulong)pvVar17 / (ulong)uVar26);
                local_1138 = (uint)bVar4;
                local_1140 = (uint)bVar5;
                if (uVar16 == 0 || bVar6 != 1) {
LAB_00264c69:
                  local_1150 = (uint)bVar6;
                  (*local_1128)(aVar9,imagep,local_1080,pbVar10,iVar20 * local_1138,
                                iVar28 * local_1140,iVar30 * local_1150,swizzle);
                  if (((ctxo->context).config.flags & 4) != 0) {
                    fVar12 = (float)local_260._28_4_ * 1.5259022e-05;
                    uVar2 = (ctxo->context).config.cw_g_weight;
                    uVar3 = (ctxo->context).config.cw_b_weight;
                    auVar33._0_4_ = (float)uVar2 * fVar12;
                    auVar33._4_4_ = (float)uVar3 * fVar12;
                    auVar33._8_4_ = fVar12 * 0.0;
                    auVar33._12_4_ = fVar12 * 0.0;
                    auVar32 = vmovlhps_avx(ZEXT416((uint)(fVar12 * (ctxo->context).config.
                                                                   cw_r_weight)),auVar33);
                    auVar32 = vshufps_avx(auVar32,auVar33,0xd8);
                    local_240.m = (__m128)vinsertps_avx(auVar32,ZEXT416((uint)(ctxo->context).config
                                                                              .cw_a_weight),0x30);
                  }
                }
                else {
                  uVar18 = iVar20 * local_1138;
                  uVar14 = uVar18 + local_1138;
                  if ((int)uVar7 < (int)(uVar18 + local_1138)) {
                    uVar14 = uVar7;
                  }
                  uVar22 = iVar28 * local_1140;
                  uVar15 = uVar22 + local_1140;
                  if ((int)uVar8 < (int)(uVar22 + local_1140)) {
                    uVar15 = uVar8;
                  }
                  if ((int)uVar22 < (int)uVar8) {
                    bVar24 = false;
                    do {
                      uVar29 = uVar18;
                      if ((int)uVar18 < (int)uVar7) {
                        do {
                          if (0.9 / ((float)(int)((local_1140 + uVar16 * 2 + -2) *
                                                 (local_1138 + uVar16 * 2 + -2)) * 255.0) <
                              (ctxo->context).input_alpha_averages[(int)(uVar22 * uVar7 + uVar29)])
                          {
                            bVar24 = true;
                            uVar29 = uVar14;
                            uVar22 = uVar15;
                          }
                          uVar29 = uVar29 + 1;
                        } while ((int)uVar29 < (int)uVar14);
                      }
                      uVar22 = uVar22 + 1;
                    } while ((int)uVar22 < (int)uVar15);
                    if (bVar24) goto LAB_00264c69;
                  }
                  local_280 = ZEXT1632(ZEXT816(0) << 0x40);
                  local_230 = true;
                  local_260 = local_280;
                }
                compress_block(&ctxo->context,(image_block *)local_1080,
                               data_out +
                               (int)(((iVar30 * iVar25 + iVar28) * uVar23 + iVar20) * 0x10),
                               pcVar11 + thread_index);
                uVar16 = (int)pvVar17 + 1;
                pvVar17 = (void *)(ulong)uVar16;
              } while (uVar16 != uVar19);
            }
            ParallelManager::complete_task_assignment(this,uVar13);
          }
          ParallelManager::wait(this,__stat_loc);
          local_10c0._8_8_ = 0;
          pcStack_10a8 = std::
                         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1094:23)>
                         ::_M_invoke;
          pcStack_10b0 = std::
                         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_entry.cpp:1094:23)>
                         ::_M_manager;
          local_10c0._M_unused._M_object = ctxo;
          ParallelManager::term(this,(function<void_()> *)&local_10c0);
          aVar31 = ASTCENC_SUCCESS;
          if (pcStack_10b0 != (code *)0x0) {
            (*pcStack_10b0)(&local_10c0,&local_10c0,__destroy_functor);
          }
        }
      }
    }
  }
  return aVar31;
}

Assistant:

astcenc_error astcenc_compress_image(
	astcenc_context* ctxo,
	astcenc_image* imagep,
	const astcenc_swizzle* swizzle,
	uint8_t* data_out,
	size_t data_len,
	unsigned int thread_index
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	(void)imagep;
	(void)swizzle;
	(void)data_out;
	(void)data_len;
	(void)thread_index;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	astcenc_error status;
	astcenc_image& image = *imagep;

	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	status = validate_compression_swizzle(*swizzle);
	if (status != ASTCENC_SUCCESS)
	{
		return status;
	}

	if (thread_index >= ctx->thread_count)
	{
		return ASTCENC_ERR_BAD_PARAM;
	}

	unsigned int block_x = ctx->config.block_x;
	unsigned int block_y = ctx->config.block_y;
	unsigned int block_z = ctx->config.block_z;

	unsigned int xblocks = (image.dim_x + block_x - 1) / block_x;
	unsigned int yblocks = (image.dim_y + block_y - 1) / block_y;
	unsigned int zblocks = (image.dim_z + block_z - 1) / block_z;

	// Check we have enough output space (16 bytes per block)
	size_t size_needed = xblocks * yblocks * zblocks * 16;
	if (data_len < size_needed)
	{
		return ASTCENC_ERR_OUT_OF_MEM;
	}

	// If context thread count is one then implicitly reset
	if (ctx->thread_count == 1)
	{
		astcenc_compress_reset(ctxo);
	}

	if (ctx->config.a_scale_radius != 0)
	{
		// First thread to enter will do setup, other threads will subsequently
		// enter the critical section but simply skip over the initialization
		auto init_avg = [ctx, &image, swizzle]() {
			// Perform memory allocations for the destination buffers
			size_t texel_count = image.dim_x * image.dim_y * image.dim_z;
			ctx->input_alpha_averages = new float[texel_count];

			return init_compute_averages(
				image, ctx->config.a_scale_radius, *swizzle,
				ctx->avg_preprocess_args);
		};

		// Only the first thread actually runs the initializer
		ctxo->manage_avg.init(init_avg);

		// All threads will enter this function and dynamically grab work
		compute_averages(*ctxo, ctx->avg_preprocess_args);
	}

	// Wait for compute_averages to complete before compressing
	ctxo->manage_avg.wait();

	compress_image(*ctxo, thread_index, image, *swizzle, data_out);

	// Wait for compress to complete before freeing memory
	ctxo->manage_compress.wait();

	auto term_compress = [ctx]() {
		delete[] ctx->input_alpha_averages;
		ctx->input_alpha_averages = nullptr;
	};

	// Only the first thread to arrive actually runs the term
	ctxo->manage_compress.term(term_compress);

	return ASTCENC_SUCCESS;
#endif
}